

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

void png_write(char *filename,image_t *image)

{
  format_t fVar1;
  uint uVar2;
  uchar *puVar3;
  FILE *__stream;
  png_bytepp image_00;
  int color_type;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  png_structp png_ptr;
  png_infop info_ptr;
  
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    png_write_cold_1();
  }
  else {
    fVar1 = image->format;
    iVar6 = 0;
    color_type = 6;
    if (fVar1 == FORMAT_GRAY8) {
      color_type = 0;
    }
    png_ptr = png_create_write_struct("1.6.44",(png_voidp)0x0,(png_error_ptr)0x0,(png_error_ptr)0x0)
    ;
    png_set_compression_level(png_ptr,1);
    info_ptr = png_create_info_struct(png_ptr);
    png_init_io(png_ptr,(png_FILE_p)__stream);
    png_set_IHDR(png_ptr,info_ptr,image->width,image->height,8,color_type,0,0,0);
    png_write_info(png_ptr,info_ptr);
    uVar4 = (ulong)image->height;
    image_00 = (png_bytepp)malloc(uVar4 * 8);
    if (uVar4 != 0) {
      puVar3 = image->data;
      uVar2 = image->width;
      uVar5 = 0;
      do {
        image_00[uVar5] = puVar3 + (uint)(iVar6 << (fVar1 != FORMAT_GRAY8) * '\x02');
        uVar5 = uVar5 + 1;
        iVar6 = iVar6 + uVar2;
      } while (uVar4 != uVar5);
    }
    png_write_image(png_ptr,image_00);
    free(image_00);
    png_write_end(png_ptr,info_ptr);
    png_destroy_write_struct(&png_ptr,&info_ptr);
    fclose(__stream);
  }
  return;
}

Assistant:

void
png_write(
    const char* filename,
    image_t* image)
{
    FILE* stream;
    png_structp png_ptr;
    png_infop info_ptr;
    png_bytepp imagep;

    int bit_depth;
    int color_type;
    int bytes_per_pixel;

    stream = fopen(filename, "wb");
    if(!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
            argv0, filename, strerror(errno));
        return;
    }

    if (image->format == FORMAT_GRAY8) {
        bit_depth = 8;
        color_type = PNG_COLOR_TYPE_GRAY;
        bytes_per_pixel = 1;
    } else /* if (image->format == FORMAT_RGBA8888) */ {
        bit_depth = 8;
        color_type = PNG_COLOR_TYPE_RGB_ALPHA;
        bytes_per_pixel = 4;
    } /* else { abort(); } */

    png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    png_set_compression_level(png_ptr, 1);
    info_ptr = png_create_info_struct(png_ptr);
    png_init_io(png_ptr, stream);

    png_set_IHDR(png_ptr, info_ptr,
        image->width, image->height, bit_depth, color_type,
        PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

    png_write_info(png_ptr, info_ptr);

    imagep = malloc(image->height * sizeof(png_byte*));
    for (unsigned int y = 0; y < image->height; ++y)
        imagep[y] = (png_byte*)(image->data + y * image->width * bytes_per_pixel);

    png_write_image(png_ptr, imagep);
    free(imagep);
    png_write_end(png_ptr, info_ptr);
    png_destroy_write_struct(&png_ptr, &info_ptr);

    fclose(stream);
}